

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O0

void btTransformUtil::integrateTransform
               (btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,btScalar timeStep,
               btTransform *predictedTransform)

{
  btTransform *this;
  btScalar *_x;
  btQuaternion *this_00;
  btTransform *in_RCX;
  btTransform *in_RDI;
  float in_XMM0_Da;
  btVector3 bVar1;
  btQuaternion predictedOrn;
  btQuaternion orn0;
  btQuaternion dorn;
  btScalar fAngle;
  btVector3 axis;
  btVector3 *this_01;
  btVector3 *in_stack_ffffffffffffff18;
  btVector3 *in_stack_ffffffffffffff20;
  btQuaternion *local_80;
  float in_stack_ffffffffffffff90;
  btScalar in_stack_ffffffffffffff94;
  btQuaternion *local_64;
  float local_5c;
  undefined1 local_58 [16];
  btScalar local_48 [4];
  btVector3 local_38;
  float local_1c;
  
  local_1c = in_XMM0_Da;
  btTransform::getOrigin(in_RDI);
  local_48 = (btScalar  [4])
             ::operator*(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18->m_floats);
  local_38 = operator+(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  btTransform::setOrigin(in_RCX,&local_38);
  btVector3::btVector3((btVector3 *)local_58);
  local_5c = btVector3::length((btVector3 *)0x1e3c76);
  if (0.7853982 < local_5c * local_1c) {
    local_5c = 0.7853982 / local_1c;
  }
  if (0.001 <= local_5c) {
    btSin(0.0);
    bVar1 = ::operator*(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18->m_floats);
    local_80 = bVar1.m_floats._0_8_;
    local_58._0_8_ = local_80;
    local_58._8_8_ = bVar1.m_floats._8_8_;
    local_80 = (btQuaternion *)local_58._8_8_;
  }
  else {
    in_stack_ffffffffffffff90 =
         local_1c * 0.5 + local_1c * local_1c * local_1c * -0.020833334 * local_5c * local_5c;
    bVar1 = ::operator*(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18->m_floats);
    in_stack_ffffffffffffff94 = bVar1.m_floats[0];
    local_64 = bVar1.m_floats._8_8_;
    local_58._0_8_ = bVar1.m_floats._0_8_;
    local_58._8_8_ = local_64;
  }
  this_01 = (btVector3 *)local_58;
  this = (btTransform *)btVector3::x(this_01);
  _x = btVector3::y(this_01);
  this_00 = (btQuaternion *)btVector3::z(this_01);
  btCos(0.0);
  btQuaternion::btQuaternion(this_00,_x,(btScalar *)this,this_01->m_floats,(btScalar *)0x1e3e68);
  btTransform::getRotation(this);
  ::operator*((btQuaternion *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),local_80
             );
  btQuaternion::normalize((btQuaternion *)this);
  btTransform::setRotation(this,(btQuaternion *)this_01);
  return;
}

Assistant:

static void integrateTransform(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep,btTransform& predictedTransform)
	{
		predictedTransform.setOrigin(curTrans.getOrigin() + linvel * timeStep);
//	#define QUATERNION_DERIVATIVE
	#ifdef QUATERNION_DERIVATIVE
		btQuaternion predictedOrn = curTrans.getRotation();
		predictedOrn += (angvel * predictedOrn) * (timeStep * btScalar(0.5));
		predictedOrn.normalize();
	#else
		//Exponential map
		//google for "Practical Parameterization of Rotations Using the Exponential Map", F. Sebastian Grassia

		btVector3 axis;
		btScalar	fAngle = angvel.length(); 
		//limit the angular motion
		if (fAngle*timeStep > ANGULAR_MOTION_THRESHOLD)
		{
			fAngle = ANGULAR_MOTION_THRESHOLD / timeStep;
		}

		if ( fAngle < btScalar(0.001) )
		{
			// use Taylor's expansions of sync function
			axis   = angvel*( btScalar(0.5)*timeStep-(timeStep*timeStep*timeStep)*(btScalar(0.020833333333))*fAngle*fAngle );
		}
		else
		{
			// sync(fAngle) = sin(c*fAngle)/t
			axis   = angvel*( btSin(btScalar(0.5)*fAngle*timeStep)/fAngle );
		}
		btQuaternion dorn (axis.x(),axis.y(),axis.z(),btCos( fAngle*timeStep*btScalar(0.5) ));
		btQuaternion orn0 = curTrans.getRotation();

		btQuaternion predictedOrn = dorn * orn0;
		predictedOrn.normalize();
	#endif
		predictedTransform.setRotation(predictedOrn);
	}